

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_generator.cpp
# Opt level: O0

void __thiscall
franca::TypeDefinitionGenerator::TypeDefinitionGenerator(TypeDefinitionGenerator *this)

{
  char local_2cf9;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>
  local_2cf8;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>
  local_2ce8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2ce0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>_&>,_2L>
  local_2cd0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2cc0;
  char local_2cad [2];
  bool_<false> local_2cab;
  terminal<boost::spirit::tag::bool_> local_2caa [2];
  terminal<boost::spirit::tag::bool_> *local_2ca8;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_2ca0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>
  local_2c90;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  local_2c80;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2c70;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2c60;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2c50;
  char *local_2c40;
  undefined1 *local_2c38;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>
  local_2c30;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  local_2c20;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  local_2c10;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  local_2c00;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>
  local_2bf0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_2be0;
  char *local_2bd8;
  undefined1 *local_2bd0;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>
  local_2bc8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2bc0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>
  local_2bb0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  local_2ba0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_2b90;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  local_2b80;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_2b70;
  bool_<false> local_2b63;
  terminal<boost::spirit::tag::bool_> local_2b62 [2];
  terminal<boost::spirit::tag::bool_> *local_2b60;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>
  local_2b58;
  char *local_2b48;
  undefined1 *local_2b40;
  char **local_2b38;
  char *local_2b30;
  undefined1 *local_2b28;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>
  local_2b20;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&>,_2L>
  local_2b10;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  local_2b00;
  expr<_a8af2228_> local_2af0;
  expr<_7127cbc4_> local_2ae0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_2ad0;
  char *local_2ac8;
  undefined1 *local_2ac0;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>
  local_2ab8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2ab0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>
  local_2aa0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  local_2a90;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_2a80;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  local_2a70;
  char local_2a59;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2a58;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  local_2a48;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  local_2a38;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2a28;
  char local_2a11;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2a10;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  local_2a00;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  local_29f0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_29e0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_29d0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_29c0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_29b0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_29a0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_2990;
  allocator local_2979;
  string local_2978;
  allocator local_2951;
  string local_2950;
  allocator local_2929;
  string local_2928;
  allocator local_2901;
  string local_2900;
  allocator local_28d9;
  string local_28d8;
  allocator local_28b1;
  string local_28b0;
  allocator local_2889;
  string local_2888;
  allocator local_2861;
  string local_2860;
  allocator local_2839;
  string local_2838;
  allocator local_2801;
  string local_2800;
  TypeDefinitionGenerator *local_27e0;
  TypeDefinitionGenerator *this_local;
  karma_rule<fidler::ast::AliasType_()> *local_27d0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_27c8;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_27c0;
  karma_rule<fidler::ast::AliasType_()> *local_27b8;
  karma_rule<fidler::ast::MapType_()> *local_27a8;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_27a0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_2798;
  karma_rule<fidler::ast::MapType_()> *local_2790;
  karma_rule<fidler::ast::UnionType_()> *local_2780;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_2778;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_2770;
  karma_rule<fidler::ast::UnionType_()> *local_2768;
  karma_rule<fidler::ast::StructType_()> *local_2758;
  proto_child0 local_2750;
  proto_child0 local_2748;
  karma_rule<fidler::ast::StructType_()> *local_2740;
  karma_rule<fidler::ast::EnumerationType_()> *local_2730;
  karma_rule<fidler::ast::ArrayType_()> *local_2728;
  karma_rule<fidler::ast::ArrayType_()> *local_2720;
  karma_rule<fidler::ast::EnumerationType_()> *local_2718;
  char *local_2708;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_2700;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_26f8;
  char *local_26f0;
  TypeGenerator *local_26e0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  *local_26d8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  *local_26d0;
  TypeGenerator *local_26c8;
  char *local_26b8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_26b0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_26a8;
  char *local_26a0;
  undefined1 *local_2690;
  char *local_2688;
  char *local_2680;
  undefined1 *local_2678;
  undefined1 *local_2668;
  char *local_2660;
  char *local_2658;
  proto_child1 local_2650;
  char *local_2640;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_2638;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_2630;
  char *local_2628;
  TypeGenerator *local_2618;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  *local_2610;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  *local_2608;
  TypeGenerator *local_2600;
  char *local_25f0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_25e8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_25e0;
  char *local_25d8;
  undefined1 *local_25c8;
  char *local_25c0;
  char *local_25b8;
  proto_child1 local_25b0;
  char *local_25a0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_2598;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_2590;
  proto_child0 local_2588;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2578;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  *local_2570;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  *local_2568;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2560;
  char *local_2550;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_2548;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_2540;
  proto_child0 local_2538;
  proto_child1 local_2528;
  proto_child0 local_2520;
  proto_child0 local_2518;
  proto_child1 local_2510;
  undefined1 *local_2500;
  char *local_24f8;
  char *local_24f0;
  undefined1 *local_24e8;
  char **local_24d8;
  char **local_24d0;
  char **local_24c0;
  char **local_24b8;
  char **local_24a8;
  char **local_24a0;
  undefined1 *local_2490;
  char *local_2488;
  char *local_2480;
  undefined1 *local_2478;
  undefined1 *local_2468;
  char *local_2460;
  char *local_2458;
  undefined1 *local_2450;
  undefined1 *local_2440;
  char *local_2438;
  char *local_2430;
  undefined1 *local_2428;
  undefined1 *local_2418;
  char *local_2410;
  char *local_2408;
  undefined1 *local_2400;
  karma_rule<fidler::ast::Enumerator_()> *local_23f0;
  karma_rule<fidler::ast::Enumerator_()> *local_23e8;
  char *local_23d8;
  expr<_a8af2228_> *local_23d0;
  expr<_a8af2228_> *local_23c8;
  proto_child0 local_23c0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_23b0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  *local_23a8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  *local_23a0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2398;
  char *local_2388;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&>,_2L>
  *local_2380;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&>,_2L>
  *local_2378;
  proto_child0 local_2370;
  proto_child1 local_2360;
  proto_child0 local_2358;
  proto_child0 local_2350;
  proto_child1 local_2348;
  char ***local_2338;
  char **local_2330;
  char **local_2328;
  char ***local_2320;
  char *local_2310;
  terminal<boost::spirit::tag::bool_> **local_2308;
  terminal<boost::spirit::tag::bool_> **local_2300;
  char *local_22f8;
  terminal<boost::spirit::tag::bool_> *local_22e8;
  terminal<boost::spirit::tag::bool_> *local_22e0;
  terminal<boost::spirit::tag::bool_> *local_22d0;
  terminal<boost::spirit::tag::bool_> *local_22c8;
  karma_rule<fidler::ast::Field_()> *local_22b8;
  karma_rule<fidler::ast::Field_()> *local_22b0;
  karma_rule<fidler::ast::Field_()> *local_22a0;
  karma_rule<fidler::ast::Field_()> *local_2298;
  char *local_2288;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_2280;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_2278;
  proto_child0 local_2270;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2260;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  *local_2258;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  *local_2250;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2248;
  char *local_2238;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_2230;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_2228;
  proto_child0 local_2220;
  proto_child1 local_2210;
  proto_child0 local_2208;
  proto_child0 local_2200;
  proto_child1 local_21f8;
  char *local_21e8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_21e0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_21d8;
  proto_child0 local_21d0;
  TypeGenerator *local_21c0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  *local_21b8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  *local_21b0;
  TypeGenerator *local_21a8;
  char *local_2198;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_2190;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>
  *local_2188;
  char *local_2180;
  TypeGenerator *local_2170;
  proto_child0 local_2168;
  proto_child0 local_2160;
  TypeGenerator *local_2158;
  char *local_2148;
  char **local_2140;
  char **local_2138;
  char *local_2130;
  undefined1 *local_2120;
  char *local_2118;
  char *local_2110;
  undefined1 *local_2108;
  char *local_20f8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_20f0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_20e8;
  char *local_20e0;
  undefined1 *local_20d0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_20c8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_20c0;
  proto_child1 local_20b8;
  char *local_20a8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  *local_20a0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  *local_2098;
  char *local_2090;
  proto_child1 local_2080;
  proto_child0 local_2078;
  proto_child0 local_2070;
  proto_child1 local_2068;
  TypeGenerator *local_2058;
  char *local_2050;
  char *local_2048;
  TypeGenerator *local_2040;
  char *local_2030;
  terminal<boost::spirit::tag::bool_> **local_2028;
  terminal<boost::spirit::tag::bool_> **local_2020;
  char *local_2018;
  char *local_2008;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>_&>,_2L>
  *local_2000;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>_&>,_2L>
  *local_1ff8;
  char *local_1ff0;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>
  *local_1fe0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_1fd8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_1fd0;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>
  *local_1fc8;
  undefined1 *local_1fb8;
  char *local_1fb0;
  proto_child0 local_1fa8;
  proto_child1 local_1fa0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>
  *local_1f90;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>
  *local_1f88;
  ExpressionGenerator *local_1f78;
  char *local_1f70;
  char *local_1f68;
  ExpressionGenerator *local_1f60;
  karma_rule<fidler::ast::ArrayType_()> *pkStack_1f50;
  expr_type that;
  expr_type that_1;
  expr_type that_2;
  expr_type that_3;
  expr_type that_4;
  expr_type that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>
  that_6;
  expr_type that_47;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>
  that_48;
  expr_type that_7;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_8;
  expr_type that_9;
  expr_type that_10;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_11;
  expr_type that_12;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>
  that_13;
  expr_type that_14;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_15;
  expr_type that_16;
  expr_type that_17;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_18;
  expr_type that_19;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>
  that_20;
  expr_type that_21;
  expr_type that_31;
  expr_type that_33;
  expr_type that_49;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_50;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_34;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_32;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_22;
  expr_type that_23;
  expr_type that_35;
  expr_type that_51;
  expr_type that_24;
  expr_type that_25;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_26;
  expr_type that_27;
  expr_type that_28;
  expr_type that_29;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_30;
  expr_type that_36;
  expr_type that_37;
  expr_type that_71;
  expr_type that_38;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>
  that_39;
  expr_type that_40;
  expr_type that_41;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_42;
  expr_type that_43;
  expr_type that_55;
  expr_type that_44;
  expr_type that_45;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_46;
  expr_type that_52;
  expr_type that_53;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_54;
  expr_type that_56;
  expr_type that_57;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_58;
  expr_type that_59;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_60;
  expr_type that_61;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_62;
  expr_type that_63;
  expr_type that_64;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_65;
  expr_type that_66;
  expr_type that_67;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_68;
  expr_type that_69;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_70;
  expr_type that_72;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_73;
  expr_type that_74;
  expr_type that_75;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_76;
  expr_type that_77;
  expr_type that_78;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_79;
  expr_type that_80;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_81;
  expr_type that_82;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_83;
  expr_type that_84;
  expr_type that_85;
  expr_type that_86;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_87;
  
  local_27e0 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2800,"unnamed-grammar",&local_2801);
  boost::spirit::karma::
  grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->super_karma_grammar<fidler::ast::TypeDefinition_()>,&this->type_definition_,
            &local_2800);
  std::__cxx11::string::~string((string *)&local_2800);
  std::allocator<char>::~allocator((allocator<char> *)&local_2801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2838,"unnamed-rule",&local_2839);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_definition_,&local_2838);
  std::__cxx11::string::~string((string *)&local_2838);
  std::allocator<char>::~allocator((allocator<char> *)&local_2839);
  TypeGenerator::TypeGenerator(&this->type_);
  ExpressionGenerator::ExpressionGenerator(&this->expression_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2860,"unnamed-rule",&local_2861);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->array_type_,&local_2860);
  std::__cxx11::string::~string((string *)&local_2860);
  std::allocator<char>::~allocator((allocator<char> *)&local_2861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2888,"unnamed-rule",&local_2889);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->enumeration_type_,&local_2888);
  std::__cxx11::string::~string((string *)&local_2888);
  std::allocator<char>::~allocator((allocator<char> *)&local_2889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28b0,"unnamed-rule",&local_28b1);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->struct_type_,&local_28b0);
  std::__cxx11::string::~string((string *)&local_28b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28d8,"unnamed-rule",&local_28d9);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->union_type_,&local_28d8);
  std::__cxx11::string::~string((string *)&local_28d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_28d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2900,"unnamed-rule",&local_2901);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->map_type_,&local_2900);
  std::__cxx11::string::~string((string *)&local_2900);
  std::allocator<char>::~allocator((allocator<char> *)&local_2901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2928,"unnamed-rule",&local_2929);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->alias_type_,&local_2928);
  std::__cxx11::string::~string((string *)&local_2928);
  std::allocator<char>::~allocator((allocator<char> *)&local_2929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2950,"unnamed-rule",&local_2951);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->enumerator_,&local_2950);
  std::__cxx11::string::~string((string *)&local_2950);
  std::allocator<char>::~allocator((allocator<char> *)&local_2951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2978,"unnamed-rule",&local_2979);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->field_,&local_2978);
  std::__cxx11::string::~string((string *)&local_2978);
  std::allocator<char>::~allocator((allocator<char> *)&local_2979);
  local_29d0.child0 = &this->array_type_;
  local_29d0.child1 = &this->enumeration_type_;
  local_29c0.child1 = &this->struct_type_;
  local_29c0.child0 = &local_29d0;
  local_29b0.child1 = &this->union_type_;
  local_29b0.child0 = &local_29c0;
  local_29a0.child1 = &this->map_type_;
  local_29a0.child0 = &local_29b0;
  local_2990.child1 = &this->alias_type_;
  local_2990.child0 = &local_29a0;
  local_27d0 = local_2990.child1;
  local_27c8 = local_2990.child0;
  local_27c0 = local_2990.child0;
  local_27b8 = local_2990.child1;
  local_27a8 = local_29a0.child1;
  local_27a0 = local_29a0.child0;
  local_2798 = local_29a0.child0;
  local_2790 = local_29a0.child1;
  local_2780 = local_29b0.child1;
  local_2778 = local_29b0.child0;
  local_2770 = local_29b0.child0;
  local_2768 = local_29b0.child1;
  local_2758 = local_29c0.child1;
  local_2750 = local_29c0.child0;
  local_2748 = local_29c0.child0;
  local_2740 = local_29c0.child1;
  local_2730 = local_29d0.child1;
  local_2728 = local_29d0.child0;
  local_2720 = local_29d0.child0;
  local_2718 = local_29d0.child1;
  pkStack_1f50 = local_29d0.child0;
  that.child0 = (proto_child0)local_29d0.child1;
  that.child1 = local_29d0.child1;
  boost::spirit::karma::operator%=(&this->type_definition_,&local_2990);
  local_2660 = "  array ";
  local_2668 = &boost::spirit::standard::string;
  local_2a10.child0.child0 = (proto_child0)0x1479bad;
  local_2a10.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2a00.child0 = &local_2a10;
  local_26b8 = " of ";
  local_2a00.child1.child0 = (proto_child0)0x1479bb6;
  local_29f0.child1 = &this->type_;
  local_29f0.child0 = &local_2a00;
  local_2a11 = '\n';
  local_29e0.child0 = &local_29f0;
  local_29e0.child1.child0 = &local_2a11;
  local_2708 = local_29e0.child1.child0;
  local_2700 = local_29e0.child0;
  local_26f8 = local_29e0.child0;
  local_26f0 = local_29e0.child1.child0;
  local_26e0 = local_29f0.child1;
  local_26d8 = local_29f0.child0;
  local_26d0 = local_29f0.child0;
  local_26c8 = local_29f0.child1;
  local_26b0 = local_2a00.child0;
  local_26a8 = local_2a00.child0;
  local_26a0 = *local_2a00.child1.child0;
  local_2658 = *local_2a10.child0.child0;
  local_2650 = local_2a10.child1;
  boost::spirit::karma::operator%=(&this->array_type_,&local_29e0);
  local_25c0 = "  typedef ";
  local_25c8 = &boost::spirit::standard::string;
  local_2a58.child0.child0 = (proto_child0)0x1479bbb;
  local_2a58.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2a48.child0 = &local_2a58;
  local_25f0 = " is ";
  local_2a48.child1.child0 = (proto_child0)0x1479bc6;
  local_2a38.child1 = &this->type_;
  local_2a38.child0 = &local_2a48;
  local_2a59 = '\n';
  local_2a28.child0 = &local_2a38;
  local_2a28.child1.child0 = &local_2a59;
  local_2640 = local_2a28.child1.child0;
  local_2638 = local_2a28.child0;
  local_2630 = local_2a28.child0;
  local_2628 = local_2a28.child1.child0;
  local_2618 = local_2a38.child1;
  local_2610 = local_2a38.child0;
  local_2608 = local_2a38.child0;
  local_2600 = local_2a38.child1;
  local_25e8 = local_2a48.child0;
  local_25e0 = local_2a48.child0;
  local_25d8 = *local_2a48.child1.child0;
  local_25b8 = *local_2a58.child0.child0;
  local_25b0 = local_2a58.child1;
  boost::spirit::karma::operator%=(&this->alias_type_,&local_2a28);
  local_24f8 = "  enumeration ";
  local_2500 = &boost::spirit::standard::string;
  local_2ab0.child0.child0 = (proto_child0)0x1479bcb;
  local_2ab0.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2410 = " extends ";
  local_2418 = &boost::spirit::standard::string;
  local_2ac8 = " extends ";
  local_2ac0 = &boost::spirit::standard::string;
  local_2ab8.child0 = (proto_child0)&local_2ac8;
  local_2aa0.child0 = &local_2ab0;
  local_2aa0.child1 = &local_2ab8;
  local_2a90.child0 = &local_2aa0;
  local_2550 = "\n  {\n";
  local_2a90.child1.child0 = (proto_child0)0x147fa2a;
  local_2ad0.child0 = &this->enumerator_;
  local_2a80.child0 = &local_2a90;
  local_2a80.child1 = &local_2ad0;
  local_2a70.child0 = &local_2a80;
  local_25a0 = "  }\n";
  local_2a70.child1.child0 = (proto_child0)0x147faee;
  local_2598 = local_2a70.child0;
  local_2590 = local_2a70.child0;
  local_2588 = local_2a70.child1.child0;
  local_2578 = local_2a80.child1;
  local_2570 = local_2a80.child0;
  local_2568 = local_2a80.child0;
  local_2560 = local_2a80.child1;
  local_2548 = local_2a90.child0;
  local_2540 = local_2a90.child0;
  local_2538 = local_2a90.child1.child0;
  local_2528 = local_2aa0.child1;
  local_2520 = local_2aa0.child0;
  local_2518 = local_2aa0.child0;
  local_2510 = local_2aa0.child1;
  local_24f0 = *local_2ab0.child0.child0;
  local_24e8 = local_2ab0.child1;
  local_24a8 = (char **)local_2ab8.child0;
  local_24a0 = (char **)local_2ab8.child0;
  local_2408 = local_2ac8;
  local_2400 = local_2ac0;
  local_23f0 = local_2ad0.child0;
  local_23e8 = local_2ad0.child0;
  boost::spirit::karma::operator%=(&this->enumeration_type_,&local_2a70);
  local_2438 = "  struct ";
  local_2440 = &boost::spirit::standard::string;
  local_2b30 = "  struct ";
  local_2b28 = &boost::spirit::standard::string;
  local_2460 = " extends ";
  local_2468 = &boost::spirit::standard::string;
  local_2b48 = " extends ";
  local_2b40 = &boost::spirit::standard::string;
  local_2b38 = &local_2b48;
  local_2b20.child0 = (proto_child0)&local_2b30;
  local_2b20.child1 = (proto_child1)&local_2b38;
  local_2b63 = (bool_<false>)0x1;
  local_24c0 = local_2b38;
  local_24b8 = local_2b38;
  local_2458 = local_2b48;
  local_2450 = local_2b40;
  local_2430 = local_2b30;
  local_2428 = local_2b28;
  local_2338 = (char ***)local_2b20.child1;
  local_2330 = (char **)local_2b20.child0;
  local_2328 = (char **)local_2b20.child0;
  local_2320 = (char ***)local_2b20.child1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_2b62,(bool *)&boost::spirit::bool_,&local_2b63);
  local_2b60 = local_2b62;
  local_2b58.child0 = (proto_child0)&local_2b60;
  local_2310 = " polymorphic";
  local_2b58.child1.child0 = (proto_child0)0x1479be4;
  local_2b10.child0 = &local_2b20;
  local_2b10.child1 = &local_2b58;
  local_2b00.child0 = &local_2b10;
  local_2388 = "\n  {\n";
  local_2b00.child1.child0 = (proto_child0)0x147fa2a;
  local_2b70.child0 = &this->field_;
  local_2af0.child0 = &local_2b00;
  local_2af0.child1 = &local_2b70;
  local_2ae0.child0 = &local_2af0;
  local_23d8 = "  }\n";
  local_2ae0.child1.child0 = (proto_child0)0x147faee;
  local_23d0 = local_2ae0.child0;
  local_23c8 = local_2ae0.child0;
  local_23c0 = local_2ae0.child1.child0;
  local_23b0 = local_2af0.child1;
  local_23a8 = local_2af0.child0;
  local_23a0 = local_2af0.child0;
  local_2398 = local_2af0.child1;
  local_2380 = local_2b00.child0;
  local_2378 = local_2b00.child0;
  local_2370 = local_2b00.child1.child0;
  local_2360 = local_2b10.child1;
  local_2358 = local_2b10.child0;
  local_2350 = local_2b10.child0;
  local_2348 = local_2b10.child1;
  local_2308 = (terminal<boost::spirit::tag::bool_> **)local_2b58.child0;
  local_2300 = (terminal<boost::spirit::tag::bool_> **)local_2b58.child0;
  local_22f8 = *local_2b58.child1.child0;
  local_22d0 = local_2b60;
  local_22c8 = local_2b60;
  local_22a0 = local_2b70.child0;
  local_2298 = local_2b70.child0;
  boost::spirit::karma::operator%=(&this->struct_type_,&local_2ae0);
  local_2688 = "  union ";
  local_2690 = &boost::spirit::standard::string;
  local_2bc0.child0.child0 = (proto_child0)0x1479bf1;
  local_2bc0.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2488 = " extends ";
  local_2490 = &boost::spirit::standard::string;
  local_2bd8 = " extends ";
  local_2bd0 = &boost::spirit::standard::string;
  local_2bc8.child0 = (proto_child0)&local_2bd8;
  local_2bb0.child0 = &local_2bc0;
  local_2bb0.child1 = &local_2bc8;
  local_2ba0.child0 = &local_2bb0;
  local_2238 = "\n  {\n";
  local_2ba0.child1.child0 = (proto_child0)0x147fa2a;
  local_2be0.child0 = &this->field_;
  local_2b90.child0 = &local_2ba0;
  local_2b90.child1 = &local_2be0;
  local_2b80.child0 = &local_2b90;
  local_2288 = "  }\n";
  local_2b80.child1.child0 = (proto_child0)0x147faee;
  local_2680 = *local_2bc0.child0.child0;
  local_2678 = local_2bc0.child1;
  local_24d8 = (char **)local_2bc8.child0;
  local_24d0 = (char **)local_2bc8.child0;
  local_2480 = local_2bd8;
  local_2478 = local_2bd0;
  local_22b8 = local_2be0.child0;
  local_22b0 = local_2be0.child0;
  local_2280 = local_2b80.child0;
  local_2278 = local_2b80.child0;
  local_2270 = local_2b80.child1.child0;
  local_2260 = local_2b90.child1;
  local_2258 = local_2b90.child0;
  local_2250 = local_2b90.child0;
  local_2248 = local_2b90.child1;
  local_2230 = local_2ba0.child0;
  local_2228 = local_2ba0.child0;
  local_2220 = local_2ba0.child1.child0;
  local_2210 = local_2bb0.child1;
  local_2208 = local_2bb0.child0;
  local_2200 = local_2bb0.child0;
  local_21f8 = local_2bb0.child1;
  boost::spirit::karma::operator%=(&this->union_type_,&local_2b80);
  local_2118 = "  map ";
  local_2120 = &boost::spirit::standard::string;
  local_2c40 = "  map ";
  local_2c38 = &boost::spirit::standard::string;
  local_2c30.child0 = (proto_child0)&local_2c40;
  local_2148 = " { ";
  local_2c30.child1.child0 = (proto_child0)0x1479c01;
  local_2c20.child1 = &this->type_;
  local_2c20.child0 = &local_2c30;
  local_2c10.child0 = &local_2c20;
  local_2198 = " to ";
  local_2c10.child1.child0 = (proto_child0)0x1479c05;
  local_2c00.child1 = &this->type_;
  local_2c00.child0 = &local_2c10;
  local_2bf0.child0 = &local_2c00;
  local_21e8 = " }\n";
  local_2bf0.child1.child0 = (proto_child0)0x147faef;
  local_21e0 = local_2bf0.child0;
  local_21d8 = local_2bf0.child0;
  local_21d0 = local_2bf0.child1.child0;
  local_21c0 = local_2c00.child1;
  local_21b8 = local_2c00.child0;
  local_21b0 = local_2c00.child0;
  local_21a8 = local_2c00.child1;
  local_2190 = local_2c10.child0;
  local_2188 = local_2c10.child0;
  local_2180 = *local_2c10.child1.child0;
  local_2170 = local_2c20.child1;
  local_2168 = local_2c20.child0;
  local_2160 = local_2c20.child0;
  local_2158 = local_2c20.child1;
  local_2140 = (char **)local_2c30.child0;
  local_2138 = (char **)local_2c30.child0;
  local_2130 = *local_2c30.child1.child0;
  local_2110 = local_2c40;
  local_2108 = local_2c38;
  boost::spirit::karma::operator%=(&this->map_type_,&local_2bf0);
  local_2c90.child1 = &this->type_;
  local_2050 = "    ";
  local_2c90.child0.child0 = (proto_child0)0x147fac3;
  local_2cab = (bool_<false>)0x1;
  local_2058 = local_2c90.child1;
  local_2048 = *local_2c90.child0.child0;
  local_2040 = local_2c90.child1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_2caa,(bool *)&boost::spirit::bool_,&local_2cab);
  local_2ca8 = local_2caa;
  local_2ca0.child0 = (proto_child0)&local_2ca8;
  local_2030 = "[]";
  local_2ca0.child1.child0 = (proto_child0)0x1473c41;
  local_2c80.child0 = &local_2c90;
  local_2c80.child1 = &local_2ca0;
  local_2cad[1] = 0x20;
  local_2c70.child0 = &local_2c80;
  local_2c70.child1.child0 = local_2cad + 1;
  local_2c60.child0 = &local_2c70;
  local_20d0 = &boost::spirit::standard::string;
  local_2c60.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2cad[0] = '\n';
  local_2c50.child0 = &local_2c60;
  local_2c50.child1.child0 = local_2cad;
  local_22e8 = local_2ca8;
  local_22e0 = local_2ca8;
  local_20f8 = local_2c50.child1.child0;
  local_20f0 = local_2c50.child0;
  local_20e8 = local_2c50.child0;
  local_20e0 = local_2c50.child1.child0;
  local_20c8 = local_2c60.child0;
  local_20c0 = local_2c60.child0;
  local_20b8 = local_2c60.child1;
  local_20a8 = local_2c70.child1.child0;
  local_20a0 = local_2c70.child0;
  local_2098 = local_2c70.child0;
  local_2090 = local_2c70.child1.child0;
  local_2080 = local_2c80.child1;
  local_2078 = local_2c80.child0;
  local_2070 = local_2c80.child0;
  local_2068 = local_2c80.child1;
  local_2028 = (terminal<boost::spirit::tag::bool_> **)local_2ca0.child0;
  local_2020 = (terminal<boost::spirit::tag::bool_> **)local_2ca0.child0;
  local_2018 = *local_2ca0.child1.child0;
  boost::spirit::karma::operator%=(&this->field_,&local_2c50);
  local_1fb0 = "    ";
  local_1fb8 = &boost::spirit::standard::string;
  local_2ce0.child0.child0 = (proto_child0)0x147fac3;
  local_2ce0.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2cf8.child1 = &this->expression_;
  local_1f70 = " = ";
  local_2cf8.child0.child0 = (proto_child0)0x1473c91;
  local_2ce8.child0 = &local_2cf8;
  local_2cd0.child0 = &local_2ce0;
  local_2cd0.child1 = &local_2ce8;
  local_2cf9 = '\n';
  local_2cc0.child0 = &local_2cd0;
  local_2cc0.child1.child0 = &local_2cf9;
  local_2008 = local_2cc0.child1.child0;
  local_2000 = local_2cc0.child0;
  local_1ff8 = local_2cc0.child0;
  local_1ff0 = local_2cc0.child1.child0;
  local_1fe0 = local_2cd0.child1;
  local_1fd8 = local_2cd0.child0;
  local_1fd0 = local_2cd0.child0;
  local_1fc8 = local_2cd0.child1;
  local_1fa8 = local_2ce0.child0.child0;
  local_1fa0 = local_2ce0.child1;
  local_1f90 = local_2ce8.child0;
  local_1f88 = local_2ce8.child0;
  local_1f78 = local_2cf8.child1;
  local_1f68 = *local_2cf8.child0.child0;
  local_1f60 = local_2cf8.child1;
  boost::spirit::karma::operator%=(&this->enumerator_,&local_2cc0);
  return;
}

Assistant:

TypeDefinitionGenerator::TypeDefinitionGenerator() :
		TypeDefinitionGenerator::base_type(type_definition_)
{
	namespace karma = boost::spirit::karma;

	type_definition_
		%= array_type_
		| enumeration_type_
		| struct_type_
		| union_type_
		| map_type_
		| alias_type_
		;

	array_type_
		%= "  array "
		<< karma::string
		<< " of "
		<< type_
		<< '\n'
		;

	alias_type_
		%= "  typedef "
		<< karma::string
		<< " is "
		<< type_
		<< '\n'
		;

	enumeration_type_
		%= "  enumeration "
		<< karma::string
		<< -(" extends " << karma::string)
		<< "\n  {\n"
		<< *enumerator_
		<< "  }\n"
		;

	struct_type_
		%= "  struct "
		<< karma::string
		<< -(" extends " << karma::string)
		<< (!karma::bool_(true) | " polymorphic")
		<< "\n  {\n"
		<< *field_
		<< "  }\n"
		;

	union_type_
		%= "  union "
		<< karma::string
		<< -(" extends " << karma::string)
		<< "\n  {\n"
		<< *field_
		<< "  }\n"
		;

	map_type_
		%= "  map "
		<< karma::string
		<< " { "
		<< type_
		<< " to "
		<< type_
		<< " }\n"
		;

	field_
		%= "    "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< '\n'
		;

	enumerator_
		%= "    "
		<< karma::string
		<< -(" = " << expression_)
		<< '\n'
		;
}